

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

void Vec_PtrFillExtra(Vec_Ptr_t *p,int nSize,void *Fill)

{
  int iVar1;
  int local_24;
  int i;
  void *Fill_local;
  int nSize_local;
  Vec_Ptr_t *p_local;
  
  if (p->nSize < nSize) {
    iVar1 = p->nCap * 2;
    if (nSize == iVar1 || SBORROW4(nSize,iVar1) != nSize + p->nCap * -2 < 0) {
      if (p->nCap < nSize) {
        Vec_PtrGrow(p,p->nCap << 1);
      }
    }
    else {
      Vec_PtrGrow(p,nSize);
    }
    for (local_24 = p->nSize; local_24 < nSize; local_24 = local_24 + 1) {
      p->pArray[local_24] = Fill;
    }
    p->nSize = nSize;
  }
  return;
}

Assistant:

static inline void Vec_PtrFillExtra( Vec_Ptr_t * p, int nSize, void * Fill )
{
    int i;
    if ( nSize <= p->nSize )
        return;
    if ( nSize > 2 * p->nCap )
        Vec_PtrGrow( p, nSize );
    else if ( nSize > p->nCap )
        Vec_PtrGrow( p, 2 * p->nCap );
    for ( i = p->nSize; i < nSize; i++ )
        p->pArray[i] = Fill;
    p->nSize = nSize;
}